

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate.cc
# Opt level: O3

bool __thiscall
bssl::ParseBasicConstraints(bssl *this,Input basic_constraints_tlv,ParsedBasicConstraints *out)

{
  Input in;
  Input in_00;
  bool bVar1;
  bool *out_00;
  Input input;
  bool has_ca;
  Input encoded_path_len;
  Input ca;
  Parser sequence_parser;
  Parser parser;
  bool local_69;
  Input local_68;
  Input local_58;
  Parser local_48;
  Parser local_30;
  
  out_00 = (bool *)basic_constraints_tlv.data_.size_;
  input.data_.size_ = (size_t)basic_constraints_tlv.data_.data_;
  input.data_.data_ = (uchar *)this;
  der::Parser::Parser(&local_30,input);
  der::Parser::Parser(&local_48);
  bVar1 = der::Parser::ReadSequence(&local_30,&local_48);
  if (bVar1) {
    *out_00 = false;
    local_58.data_.data_ = (uchar *)0x0;
    local_58.data_.size_ = 0;
    bVar1 = der::Parser::ReadOptionalTag(&local_48,1,&local_58,&local_69);
    if ((bVar1) &&
       ((local_69 != true ||
        (in_00.data_.size_ = local_58.data_.size_, in_00.data_.data_ = local_58.data_.data_,
        bVar1 = der::ParseBool(in_00,out_00), bVar1)))) {
      local_68.data_.data_ = (uchar *)0x0;
      local_68.data_.size_ = 0;
      bVar1 = der::Parser::ReadOptionalTag(&local_48,2,&local_68,out_00 + 1);
      if (bVar1) {
        if (out_00[1] == true) {
          in.data_.size_ = local_68.data_.size_;
          in.data_.data_ = local_68.data_.data_;
          bVar1 = der::ParseUint8(in,out_00 + 2);
          if (!bVar1) {
            return false;
          }
        }
        else {
          out_00[2] = false;
        }
        bVar1 = der::Parser::HasMore(&local_48);
        if (!bVar1) {
          bVar1 = der::Parser::HasMore(&local_30);
          return !bVar1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ParseBasicConstraints(der::Input basic_constraints_tlv,
                           ParsedBasicConstraints *out) {
  der::Parser parser(basic_constraints_tlv);

  //    BasicConstraints ::= SEQUENCE {
  der::Parser sequence_parser;
  if (!parser.ReadSequence(&sequence_parser)) {
    return false;
  }

  //         cA                      BOOLEAN DEFAULT FALSE,
  out->is_ca = false;
  bool has_ca;
  der::Input ca;
  if (!sequence_parser.ReadOptionalTag(CBS_ASN1_BOOLEAN, &ca, &has_ca)) {
    return false;
  }
  if (has_ca) {
    if (!der::ParseBool(ca, &out->is_ca)) {
      return false;
    }
    // TODO(eroman): Should reject if CA was set to false, since
    // DER-encoding requires DEFAULT values be omitted. In
    // practice however there are a lot of certificates that use
    // the broken encoding.
  }

  //         pathLenConstraint       INTEGER (0..MAX) OPTIONAL }
  der::Input encoded_path_len;
  if (!sequence_parser.ReadOptionalTag(CBS_ASN1_INTEGER, &encoded_path_len,
                                       &out->has_path_len)) {
    return false;
  }
  if (out->has_path_len) {
    // TODO(eroman): Surface reason for failure if length was longer than uint8.
    if (!der::ParseUint8(encoded_path_len, &out->path_len)) {
      return false;
    }
  } else {
    // Default initialize to 0 as a precaution.
    out->path_len = 0;
  }

  // There shouldn't be any unconsumed data in the extension.
  if (sequence_parser.HasMore()) {
    return false;
  }

  // By definition the input was a single BasicConstraints sequence, so there
  // shouldn't be unconsumed data.
  if (parser.HasMore()) {
    return false;
  }

  return true;
}